

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer(void)

{
  uint64_t uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 *unaff_RBX;
  long *plVar4;
  undefined8 in_R9;
  long lVar5;
  int64_t eval_b_3;
  int64_t eval_b_5;
  uv_timer_t never;
  uv_timer_t repeat;
  uv_timer_t once_timers [10];
  long lStack_5d8;
  code *pcStack_5d0;
  long local_5c8;
  long local_5c0;
  long local_5b8 [15];
  uint64_t local_540 [15];
  undefined8 local_4c8 [150];
  
  plVar4 = &local_5c8;
  pcStack_5d0 = (code *)0x1d5d81;
  uVar3 = uv_default_loop();
  pcStack_5d0 = (code *)0x1d5d89;
  start_time = uv_now(uVar3);
  local_4c8[0] = 0;
  local_540[0] = start_time;
  if ((long)start_time < 1) {
LAB_001d60b8:
    pcStack_5d0 = (code *)0x1d60cd;
    run_test_timer_cold_1();
LAB_001d60cd:
    pcStack_5d0 = (code *)0x1d60da;
    run_test_timer_cold_4();
LAB_001d60da:
    pcStack_5d0 = (code *)0x1d60e7;
    run_test_timer_cold_5();
LAB_001d60e7:
    pcStack_5d0 = (code *)0x1d60f4;
    run_test_timer_cold_6();
LAB_001d60f4:
    pcStack_5d0 = (code *)0x1d6101;
    run_test_timer_cold_7();
LAB_001d6101:
    pcStack_5d0 = (code *)0x1d610e;
    run_test_timer_cold_8();
LAB_001d610e:
    pcStack_5d0 = (code *)0x1d611b;
    run_test_timer_cold_9();
LAB_001d611b:
    pcStack_5d0 = (code *)0x1d6128;
    run_test_timer_cold_10();
LAB_001d6128:
    pcStack_5d0 = (code *)0x1d6135;
    run_test_timer_cold_11();
LAB_001d6135:
    pcStack_5d0 = (code *)0x1d6142;
    run_test_timer_cold_12();
  }
  else {
    unaff_RBX = local_4c8;
    lVar5 = 0;
    uVar1 = start_time;
    do {
      local_540[0] = uVar1;
      pcStack_5d0 = (code *)0x1d5dd1;
      uVar3 = uv_default_loop();
      pcStack_5d0 = (code *)0x1d5ddc;
      iVar2 = uv_timer_init(uVar3,unaff_RBX);
      local_540[0] = (uint64_t)iVar2;
      local_5b8[0] = 0;
      if (local_540[0] != 0) {
LAB_001d60a6:
        pcStack_5d0 = (code *)0x1d60b8;
        run_test_timer_cold_2();
        goto LAB_001d60b8;
      }
      pcStack_5d0 = (code *)0x1d5e12;
      iVar2 = uv_timer_start(unaff_RBX,once_cb,lVar5,0);
      local_540[0] = (uint64_t)iVar2;
      local_5b8[0] = 0;
      if (local_540[0] != 0) {
        pcStack_5d0 = (code *)0x1d60a6;
        run_test_timer_cold_3();
        goto LAB_001d60a6;
      }
      unaff_RBX = unaff_RBX + 0xf;
      lVar5 = lVar5 + 0x32;
      uVar1 = 0;
    } while (lVar5 != 500);
    pcStack_5d0 = (code *)0x1d5e4e;
    uVar3 = uv_default_loop();
    pcStack_5d0 = (code *)0x1d5e5e;
    iVar2 = uv_timer_init(uVar3,local_540);
    local_5b8[0] = (long)iVar2;
    local_5c8 = 0;
    if (local_5b8[0] != 0) goto LAB_001d60cd;
    pcStack_5d0 = (code *)0x1d5e9a;
    iVar2 = uv_timer_start(local_540,repeat_cb,100,100);
    local_5b8[0] = (long)iVar2;
    local_5c8 = 0;
    if (local_5b8[0] != 0) goto LAB_001d60da;
    pcStack_5d0 = (code *)0x1d5ebd;
    uVar3 = uv_default_loop();
    pcStack_5d0 = (code *)0x1d5eca;
    iVar2 = uv_timer_init(uVar3,local_5b8);
    local_5c8 = (long)iVar2;
    local_5c0 = 0;
    if (local_5c8 != 0) goto LAB_001d60e7;
    pcStack_5d0 = (code *)0x1d5f03;
    iVar2 = uv_timer_start(local_5b8,never_cb,100,100);
    local_5c8 = (long)iVar2;
    local_5c0 = 0;
    if (local_5c8 != 0) goto LAB_001d60f4;
    pcStack_5d0 = (code *)0x1d5f2b;
    iVar2 = uv_timer_stop(local_5b8);
    local_5c8 = (long)iVar2;
    local_5c0 = 0;
    if (local_5c8 != 0) goto LAB_001d6101;
    pcStack_5d0 = (code *)0x1d5f53;
    uv_unref(local_5b8);
    pcStack_5d0 = (code *)0x1d5f58;
    uVar3 = uv_default_loop();
    pcStack_5d0 = (code *)0x1d5f62;
    uv_run(uVar3,0);
    local_5c8 = 10;
    local_5c0 = (long)once_cb_called;
    if (local_5c0 != 10) goto LAB_001d610e;
    local_5c8 = 10;
    local_5c0 = (long)once_close_cb_called;
    if (local_5c0 != 10) goto LAB_001d611b;
    pcStack_5d0 = (code *)0x1d5fbc;
    printf("repeat_cb_called %d\n",(ulong)(uint)repeat_cb_called);
    local_5c8 = 5;
    local_5c0 = (long)repeat_cb_called;
    if (local_5c0 != 5) goto LAB_001d6128;
    local_5c8 = 1;
    local_5c0 = (long)repeat_close_cb_called;
    if (local_5c0 != 1) goto LAB_001d6135;
    local_5c8 = 500;
    pcStack_5d0 = (code *)0x1d600f;
    uVar3 = uv_default_loop();
    pcStack_5d0 = (code *)0x1d6017;
    local_5c0 = uv_now(uVar3);
    local_5c0 = local_5c0 - start_time;
    if (local_5c8 <= local_5c0) {
      pcStack_5d0 = (code *)0x1d6037;
      unaff_RBX = (undefined8 *)uv_default_loop();
      pcStack_5d0 = (code *)0x1d604b;
      uv_walk(unaff_RBX,close_walk_cb,0);
      pcStack_5d0 = (code *)0x1d6055;
      uv_run(unaff_RBX,0);
      local_5c8 = 0;
      pcStack_5d0 = (code *)0x1d6062;
      uVar3 = uv_default_loop();
      pcStack_5d0 = (code *)0x1d606a;
      iVar2 = uv_loop_close(uVar3);
      local_5c0 = (long)iVar2;
      if (local_5c8 == local_5c0) {
        pcStack_5d0 = (code *)0x1d6085;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d614f;
    }
  }
  pcStack_5d0 = (code *)0x1d614f;
  run_test_timer_cold_14();
LAB_001d614f:
  pcStack_5d0 = once_cb;
  run_test_timer_cold_13();
  pcStack_5d0 = (code *)unaff_RBX;
  printf("ONCE_CB %d\n",(ulong)(uint)once_cb_called);
  if (plVar4 == (long *)0x0) {
    once_cb_cold_2();
  }
  else {
    iVar2 = uv_is_active(plVar4);
    lStack_5d8 = (long)iVar2;
    if (lStack_5d8 == 0) {
      once_cb_called = once_cb_called + 1;
      uv_close(plVar4,once_close_cb);
      uVar3 = uv_default_loop();
      iVar2 = uv_update_time(uVar3);
      return iVar2;
    }
  }
  plVar4 = &lStack_5d8;
  once_cb_cold_1();
  puts("REPEAT_CB");
  if (plVar4 == (long *)0x0) {
    repeat_cb_cold_2();
  }
  else {
    iVar2 = uv_is_active(plVar4);
    if (iVar2 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        iVar2 = uv_close(plVar4,repeat_close_cb);
        return iVar2;
      }
      return repeat_cb_called;
    }
  }
  repeat_cb_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,0x6f,"never_cb should never be called",in_R9,plVar4);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(timer) {
  uv_timer_t once_timers[10];
  uv_timer_t *once;
  uv_timer_t repeat, never;
  unsigned int i;
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT_LT(0, start_time);

  /* Let 10 timers time out in 500 ms total. */
  for (i = 0; i < ARRAY_SIZE(once_timers); i++) {
    once = once_timers + i;
    r = uv_timer_init(uv_default_loop(), once);
    ASSERT_OK(r);
    r = uv_timer_start(once, once_cb, i * 50, 0);
    ASSERT_OK(r);
  }

  /* The 11th timer is a repeating timer that runs 4 times */
  r = uv_timer_init(uv_default_loop(), &repeat);
  ASSERT_OK(r);
  r = uv_timer_start(&repeat, repeat_cb, 100, 100);
  ASSERT_OK(r);

  /* The 12th timer should not do anything. */
  r = uv_timer_init(uv_default_loop(), &never);
  ASSERT_OK(r);
  r = uv_timer_start(&never, never_cb, 100, 100);
  ASSERT_OK(r);
  r = uv_timer_stop(&never);
  ASSERT_OK(r);
  uv_unref((uv_handle_t*)&never);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(10, once_cb_called);
  ASSERT_EQ(10, once_close_cb_called);
  printf("repeat_cb_called %d\n", repeat_cb_called);
  ASSERT_EQ(5, repeat_cb_called);
  ASSERT_EQ(1, repeat_close_cb_called);

  ASSERT_LE(500, uv_now(uv_default_loop()) - start_time);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}